

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

Index __thiscall
PlanningUnitMADPDiscrete::GetTimeStepForAHI(PlanningUnitMADPDiscrete *this,Index agI,Index ahI)

{
  ulong uVar1;
  pointer pvVar2;
  long lVar3;
  Index IVar4;
  ActionHistoryTree *pAVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((this->_m_params)._m_individualActionHistories == true) {
    pAVar5 = GetActionHistoryTree(this,agI,ahI);
    IVar4 = (Index)(pAVar5->_m_containedElem->super_IndividualHistory).super_History._m_length;
  }
  else {
    uVar1 = (this->super_PlanningUnit)._m_horizon;
    if (uVar1 == 0) {
      IVar4 = 0xffffffff;
    }
    else {
      uVar7 = (ulong)agI;
      pvVar2 = (this->_m_firstAHIforT).
               super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->_m_firstAHIforT).
                     super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
      if (uVar6 < uVar7 || uVar6 - uVar7 == 0) {
LAB_0040a8df:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                   ,uVar6);
      }
      lVar3 = *(long *)&pvVar2[uVar7].
                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                        _M_impl.super__Vector_impl_data;
      uVar6 = (long)*(pointer *)
                     ((long)&pvVar2[uVar7].
                             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                             ._M_impl.super__Vector_impl_data + 8) - lVar3 >> 3;
      uVar7 = 0;
      do {
        if (uVar6 <= uVar7) goto LAB_0040a8df;
      } while ((*(ulong *)(lVar3 + uVar7 * 8) <= (ulong)ahI) &&
              (uVar7 = (ulong)((int)uVar7 + 1), uVar7 < uVar1));
      IVar4 = (int)uVar7 - 1;
    }
  }
  return IVar4;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetTimeStepForAHI(Index agI, Index ahI) const
{
    if(_m_params.GetComputeIndividualActionHistories())
        return(GetActionHistoryTree(agI, ahI)->GetContainedElement()->
                GetLength() );

    //else... find out what time step this is a joh for
    Index t = 0;
    size_t h=GetHorizon();
    while(  t < h && _m_firstAHIforT.at(agI).at(t) <= ahI )
        t++;

    //  _m_firstJAHIforT[t] > ahI  OR t==GetHorizon
    if(t == h)
        t--; //last time step is h-1
    else
        t--;//_m_nrJointActionHistoriesT[t] > ahI so ahI belongs to 
            //previous time step.
    return(t);
}